

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

const_iterator avro::findField(Entity *e,Object *m,string *fieldName)

{
  const_iterator cVar1;
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          ::find(&m->_M_t,fieldName);
  if ((_Rb_tree_header *)cVar1._M_node != &(m->_M_t)._M_impl.super__Rb_tree_header) {
    return (const_iterator)cVar1._M_node;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"Missing Json field \"%1%\": %2%");
  pbVar2 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                     (&local_100,fieldName);
  json::Entity::toString_abi_cxx11_(&local_120,e);
  pbVar2 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                     (pbVar2,&local_120);
  Exception::Exception(this,pbVar2);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

const json::Object::const_iterator findField(const Entity& e,
    const Object& m, const string& fieldName)
{
    Object::const_iterator it = m.find(fieldName);
    if (it == m.end()) {
        throw Exception(boost::format("Missing Json field \"%1%\": %2%") %
            fieldName % e.toString());
    } else {
        return it;
    }
}